

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

void __thiscall xmrig::CudaBackend::stop(CudaBackend *this)

{
  undefined *puVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  Workers<xmrig::CudaLaunchData> *in_stack_00000010;
  uint64_t ts;
  vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *in_stack_fffffffffffffff0;
  
  bVar2 = std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::empty
                    (in_stack_fffffffffffffff0);
  if (!bVar2) {
    uVar3 = Chrono::steadyMSecs();
    Workers<xmrig::CudaLaunchData>::stop(in_stack_00000010);
    std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::clear
              ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)0x2237c9);
    puVar1 = tag;
    uVar4 = Chrono::steadyMSecs();
    Log::print(INFO,"%s\x1b[0;33m stopped\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m",puVar1,uVar4 - uVar3);
  }
  return;
}

Assistant:

void xmrig::CudaBackend::stop()
{
    if (d_ptr->threads.empty()) {
        return;
    }

    const uint64_t ts = Chrono::steadyMSecs();

    d_ptr->workers.stop();
    d_ptr->threads.clear();

    LOG_INFO("%s" YELLOW(" stopped") BLACK_BOLD(" (%" PRIu64 " ms)"), tag, Chrono::steadyMSecs() - ts);
}